

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_entry_retriever.cpp
# Opt level: O2

void __thiscall
duckdb::CatalogEntryRetriever::SetSearchPath
          (CatalogEntryRetriever *this,vector<duckdb::CatalogSearchEntry,_true> *entries)

{
  pointer pCVar1;
  bool bVar2;
  ClientData *pCVar3;
  type pCVar4;
  pointer pCVar5;
  CatalogSearchEntry *entry;
  vector<duckdb::CatalogSearchEntry,_true> new_path;
  CatalogSearchEntry path;
  vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_> local_88;
  
  local_88.
  super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pCVar1 = (entries->
           super_vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>).
           super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pCVar5 = (entries->
                super_vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
                ).
                super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
                ._M_impl.super__Vector_impl_data._M_start; pCVar5 != pCVar1; pCVar5 = pCVar5 + 1) {
    bVar2 = IsInvalidCatalog(&pCVar5->catalog);
    if (!bVar2) {
      bVar2 = ::std::operator==(&pCVar5->catalog,"system");
      if (!bVar2) {
        bVar2 = ::std::operator==(&pCVar5->catalog,"temp");
        if (!bVar2) {
          ::std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>::
          emplace_back<duckdb::CatalogSearchEntry>(&local_88,pCVar5);
        }
      }
    }
  }
  if (local_88.
      super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_88.
      super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pCVar3 = ClientData::Get(this->context);
    pCVar4 = unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
             ::operator*(&pCVar3->catalog_search_path);
    pCVar1 = (pCVar4->set_paths).
             super_vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
             super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pCVar5 = (pCVar4->set_paths).
                  super_vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
                  .
                  super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start; pCVar5 != pCVar1; pCVar5 = pCVar5 + 1)
    {
      CatalogSearchEntry::CatalogSearchEntry((CatalogSearchEntry *)&stack0xffffffffffffff90,pCVar5);
      bVar2 = IsInvalidCatalog((string *)&stack0xffffffffffffff90);
      if (bVar2) {
        DatabaseManager::GetDefaultDatabase_abi_cxx11_(this->context);
        ::std::__cxx11::string::_M_assign((string *)&stack0xffffffffffffff90);
      }
      ::std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>::
      emplace_back<duckdb::CatalogSearchEntry>
                (&local_88,(CatalogSearchEntry *)&stack0xffffffffffffff90);
      CatalogSearchEntry::~CatalogSearchEntry((CatalogSearchEntry *)&stack0xffffffffffffff90);
    }
    make_shared_ptr<duckdb::CatalogSearchPath,duckdb::ClientContext&,duckdb::vector<duckdb::CatalogSearchEntry,true>>
              ((ClientContext *)&stack0xffffffffffffff90,
               (vector<duckdb::CatalogSearchEntry,_true> *)this->context);
    shared_ptr<duckdb::CatalogSearchPath,_true>::operator=
              (&this->search_path,
               (shared_ptr<duckdb::CatalogSearchPath,_true> *)&stack0xffffffffffffff90);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffff98);
  }
  ::std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>::~vector
            (&local_88);
  return;
}

Assistant:

void CatalogEntryRetriever::SetSearchPath(vector<CatalogSearchEntry> entries) {
	vector<CatalogSearchEntry> new_path;
	for (auto &entry : entries) {
		if (IsInvalidCatalog(entry.catalog) || entry.catalog == SYSTEM_CATALOG || entry.catalog == TEMP_CATALOG) {
			continue;
		}
		new_path.push_back(std::move(entry));
	}
	if (new_path.empty()) {
		return;
	}

	// push the set paths from the ClientContext behind the provided paths
	auto &client_search_path = *ClientData::Get(context).catalog_search_path;
	auto &set_paths = client_search_path.GetSetPaths();
	for (auto path : set_paths) {
		if (IsInvalidCatalog(path.catalog)) {
			path.catalog = DatabaseManager::GetDefaultDatabase(context);
		}
		new_path.push_back(std::move(path));
	}

	this->search_path = make_shared_ptr<CatalogSearchPath>(context, std::move(new_path));
}